

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O3

void Acb_ObjRemoveBufInv(Acb_Ntk_t *p,int iObj)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  uint iObj_00;
  int iVar4;
  ulong uVar5;
  Vec_Int_t *pVVar6;
  word *pwVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  char *__assertion;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  bool bVar20;
  
  if (iObj < 1) {
    __assertion = "i>0";
  }
  else {
    uVar3 = (p->vObjTruth).nSize;
    if (0 < (int)uVar3) {
      if (uVar3 <= (uint)iObj) {
LAB_003aad6b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if ((p->vObjType).nSize <= iObj) {
LAB_003aac4f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if (0xfd < (byte)((p->vObjType).pArray[(uint)iObj] - 5U)) {
        __assert_fail("!Acb_ObjIsCio(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                      ,0xe0,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
      }
      if ((p->vObjFans).nSize <= iObj) goto LAB_003aaccb;
      iVar19 = (p->vObjFans).pArray[(uint)iObj];
      if (((long)iVar19 < 0) || ((p->vFanSto).nSize <= iVar19)) goto LAB_003aac8d;
      if ((p->vFanSto).pArray[iVar19] != 1) {
        __assert_fail("Acb_ObjFaninNum(p, iObj) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                      ,0xe1,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
      }
      uVar5 = (p->vObjTruth).pArray[(uint)iObj];
      if ((uVar5 != 0xaaaaaaaaaaaaaaaa) && (uVar5 != 0x5555555555555555)) {
        __assert_fail("uTruth == s_Truths6[0] || ~uTruth == s_Truths6[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                      ,0xe2,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
      }
      iVar19 = (p->vFanouts).nSize;
      while (iObj < iVar19) {
        pVVar6 = (p->vFanouts).pArray;
        uVar3 = pVVar6[(uint)iObj].nSize;
        if ((int)uVar3 < 1) {
LAB_003aaa50:
          if ((uVar5 & 1) != 0) goto LAB_003aaaea;
          goto LAB_003aaa5f;
        }
        uVar12 = 0;
        while( true ) {
          iObj_00 = pVVar6[(uint)iObj].pArray[uVar12];
          lVar18 = (long)(int)iObj_00;
          if (lVar18 < 1) goto LAB_003aac6e;
          if ((p->vObjType).nSize <= (int)iObj_00) goto LAB_003aac4f;
          uVar14 = (uint)(byte)(p->vObjType).pArray[lVar18];
          if ((4 < uVar14) || ((0x19U >> (uVar14 & 0x1f) & 1) == 0)) break;
          uVar12 = uVar12 + 1;
          if (uVar3 == uVar12) goto LAB_003aaa50;
        }
        iVar19 = (p->vObjFans).nSize;
        if (iVar19 <= iObj) goto LAB_003aaccb;
        piVar8 = (p->vObjFans).pArray;
        iVar4 = piVar8[(uint)iObj];
        if (((long)iVar4 < 0) || (uVar3 = (p->vFanSto).nSize, (int)uVar3 <= iVar4))
        goto LAB_003aac8d;
        if (iVar19 <= (int)iObj_00) goto LAB_003aaccb;
        uVar14 = piVar8[lVar18];
        if (((long)(int)uVar14 < 0) || (uVar3 <= uVar14)) goto LAB_003aac8d;
        piVar8 = (p->vFanSto).pArray;
        puVar2 = (uint *)(piVar8 + (int)uVar14);
        uVar3 = *puVar2;
        uVar12 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar12 = 0;
        }
        uVar13 = 0;
        do {
          if (uVar12 == uVar13) {
            iVar19 = -1;
            goto LAB_003aa9bf;
          }
          uVar1 = uVar13 + 1;
          lVar15 = uVar13 + 1;
          uVar13 = uVar1;
        } while (puVar2[lVar15] != iObj);
        iVar19 = (int)uVar1 + -1;
LAB_003aa9bf:
        Acb_ObjPatchFanin(p,iObj_00,iObj,piVar8[(long)iVar4 + 1]);
        if ((uVar5 & 1) != 0) {
          uVar3 = (p->vObjTruth).nSize;
          if ((int)uVar3 < 1) goto LAB_003aad8a;
          if (uVar3 <= iObj_00) goto LAB_003aad6b;
          pwVar7 = (p->vObjTruth).pArray;
          uVar12 = pwVar7[lVar18];
          bVar11 = (byte)(1 << ((byte)iVar19 & 0x1f));
          pwVar7[lVar18] =
               uVar12 << (bVar11 & 0x3f) & s_Truths6[iVar19] |
               (uVar12 & s_Truths6[iVar19]) >> (bVar11 & 0x3f);
        }
        Acb_ObjRemoveDupFanins(p,iObj_00);
        iVar19 = (p->vFanouts).nSize;
      }
      goto LAB_003aacac;
    }
LAB_003aad8a:
    __assertion = "Acb_NtkHasObjTruths(p)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
LAB_003aaa5f:
  iVar19 = (p->vFanouts).nSize;
  if (iVar19 <= iObj) goto LAB_003aacac;
  pVVar6 = (p->vFanouts).pArray;
  if (pVVar6[(uint)iObj].nSize < 1) goto LAB_003aaaea;
  if ((p->vObjFans).nSize <= iObj) goto LAB_003aaccb;
  iVar19 = (p->vObjFans).pArray[(uint)iObj];
  if (((long)iVar19 < 0) || ((p->vFanSto).nSize <= iVar19)) goto LAB_003aac8d;
  iVar4 = *pVVar6[(uint)iObj].pArray;
  if ((long)iVar4 < 1) {
LAB_003aac6e:
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= iVar4) goto LAB_003aac4f;
  if ((p->vObjType).pArray[iVar4] != '\x04') {
    __assert_fail("Acb_ObjIsCo(p, iFanout)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                  ,0xf3,"void Acb_ObjRemoveBufInv(Acb_Ntk_t *, int)");
  }
  Acb_ObjPatchFanin(p,iVar4,iObj,(p->vFanSto).pArray[(long)iVar19 + 1]);
  goto LAB_003aaa5f;
LAB_003aaaea:
  if (iVar19 <= iObj) {
LAB_003aacac:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar6 = (p->vFanouts).pArray;
  if (pVVar6[(uint)iObj].nSize != 0) {
    return;
  }
  iVar19 = (p->vObjFans).nSize;
  if (iVar19 <= iObj) {
LAB_003aaccb:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar8 = (p->vObjFans).pArray;
  iVar4 = piVar8[(uint)iObj];
  lVar18 = (long)iVar4;
  if ((-1 < lVar18) && (iVar4 < (p->vFanSto).nSize)) {
    piVar9 = (p->vFanSto).pArray;
    if (0 < piVar9[lVar18]) {
      lVar15 = 0;
      do {
        iVar19 = (piVar9 + lVar18)[lVar15 + 1];
        lVar16 = (long)iVar19;
        if ((lVar16 < 0) || ((p->vFanouts).nSize <= iVar19)) goto LAB_003aacac;
        iVar19 = pVVar6[lVar16].nSize;
        if ((long)iVar19 < 1) {
          if (iVar19 != 0) {
            __assert_fail("i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
          }
LAB_003aad2d:
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                        ,0x223,"void Acb_ObjRemoveFaninFanout(Acb_Ntk_t *, int)");
        }
        lVar15 = lVar15 + 1;
        piVar10 = pVVar6[lVar16].pArray;
        lVar17 = 1;
        while (piVar10[lVar17 + -1] != iObj) {
          bVar20 = lVar17 == iVar19;
          lVar17 = lVar17 + 1;
          if (bVar20) goto LAB_003aad2d;
        }
        if ((int)lVar17 < iVar19) {
          do {
            piVar10[lVar17 + -1] = piVar10[lVar17];
            lVar17 = lVar17 + 1;
            iVar19 = pVVar6[lVar16].nSize;
          } while ((int)lVar17 < iVar19);
        }
        pVVar6[lVar16].nSize = iVar19 + -1;
      } while (lVar15 < piVar9[lVar18]);
      iVar19 = (p->vObjFans).nSize;
    }
    if (iVar19 <= iObj) goto LAB_003aaccb;
    iVar19 = piVar8[(uint)iObj];
    if ((-1 < (long)iVar19) && (iVar19 < (p->vFanSto).nSize)) {
      puVar2 = (uint *)(piVar9 + iVar19);
      uVar3 = *puVar2;
      if (0 < (int)uVar3) {
        lVar18 = 1;
        do {
          if ((int)puVar2[lVar18] < 1) {
            __assert_fail("pFanins[i] > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                          ,0x1c8,"void Acb_ObjRemoveFanins(Acb_Ntk_t *, int)");
          }
          puVar2[lVar18] = 0xffffffff;
          lVar18 = lVar18 + 1;
        } while ((ulong)uVar3 + 1 != lVar18);
      }
      *puVar2 = 0;
      if (iObj < (p->vObjType).nSize) {
        (p->vObjType).pArray[(uint)iObj] = '\0';
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                    ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
    }
  }
LAB_003aac8d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

void Acb_ObjRemoveBufInv( Acb_Ntk_t * p, int iObj )
{
    int iFanout;
    word uTruth = Acb_ObjTruth( p, iObj );
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( Acb_ObjFaninNum(p, iObj) == 1 );
    assert( uTruth == s_Truths6[0] || ~uTruth == s_Truths6[0] );
    while ( (iFanout = Acb_ObjFindNodeFanout(p, iObj)) >= 0 )
    {
        int iFanin = Acb_ObjFanin( p, iObj, 0 );
        int iObjIndex = Acb_ObjWhatFanin( p, iFanout, iObj );
        Acb_ObjPatchFanin( p, iFanout, iObj, iFanin );
        if ( uTruth & 1 ) // inv
        {
            word uTruthF = Acb_ObjTruth( p, iFanout );
            Vec_WrdWriteEntry( &p->vObjTruth, iFanout, Abc_Tt6Flip(uTruthF, iObjIndex) );
        }
        Acb_ObjRemoveDupFanins( p, iFanout );
    }
    while ( (uTruth & 1) == 0 && Acb_ObjFanoutNum(p, iObj) > 0 )
    {
        int iFanin = Acb_ObjFanin( p, iObj, 0 );
        int iFanout = Acb_ObjFanout( p, iObj, 0 );
        assert( Acb_ObjIsCo(p, iFanout) );
        Acb_ObjPatchFanin( p, iFanout, iObj, iFanin );
    }
    if ( Acb_ObjFanoutNum(p, iObj) == 0 )
    {
        Acb_ObjRemoveFaninFanout( p, iObj );
        Acb_ObjRemoveFanins( p, iObj );
        Acb_ObjCleanType( p, iObj );
    }
}